

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O3

bool embree::avx::FlatLinearCurveMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  ulong uVar14;
  float fVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  float fVar20;
  float fVar25;
  float fVar26;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  float fVar28;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  float fVar35;
  float fVar39;
  float fVar40;
  undefined1 auVar36 [16];
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar56;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<4> hit;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  Primitive *local_270;
  RayQueryContext *local_268;
  RTCFilterFunctionNArguments local_260;
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar55 [64];
  
  pSVar8 = context->scene;
  uVar17 = line->sharedGeomID;
  uVar4 = (line->v0).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[uVar17].ptr;
  fVar28 = (pGVar9->time_range).lower;
  fVar28 = pGVar9->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar28) / ((pGVar9->time_range).upper - fVar28));
  auVar29 = vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),9);
  auVar29 = vminss_avx(auVar29,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar48 = vmaxss_avx(ZEXT816(0) << 0x20,auVar29);
  lVar10 = *(long *)&pGVar9[3].time_range.upper;
  lVar19 = (long)(int)auVar48._0_4_ * 0x38;
  lVar11 = *(long *)(lVar10 + lVar19);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar19);
  auVar29 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar4);
  uVar5 = (line->v0).field_0.i[1];
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar5);
  uVar6 = (line->v0).field_0.i[2];
  auVar22 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar6);
  uVar7 = (line->v0).field_0.i[3];
  auVar3 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)uVar7);
  auVar23 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar4 + 1));
  auVar30 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar5 + 1));
  auVar36 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar6 + 1));
  auVar37 = *(undefined1 (*) [16])(lVar11 + lVar12 * (ulong)(uVar7 + 1));
  lVar11 = *(long *)(lVar10 + 0x38 + lVar19);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar19);
  auVar42 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * lVar10);
  auVar43 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * lVar10);
  auVar44 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * lVar10);
  auVar45 = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * lVar10);
  auVar46 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * lVar10);
  auVar47 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * lVar10);
  fVar28 = fVar28 - auVar48._0_4_;
  auVar48 = vunpcklps_avx(auVar29,auVar22);
  auVar29 = vunpckhps_avx(auVar29,auVar22);
  auVar22 = vunpcklps_avx(auVar21,auVar3);
  auVar21 = vunpckhps_avx(auVar21,auVar3);
  auVar49 = vunpcklps_avx(auVar48,auVar22);
  auVar22 = vunpckhps_avx(auVar48,auVar22);
  auVar48 = vunpcklps_avx(auVar29,auVar21);
  auVar3 = vunpckhps_avx(auVar29,auVar21);
  auVar53 = vunpcklps_avx(auVar23,auVar36);
  auVar29 = vunpckhps_avx(auVar23,auVar36);
  auVar23 = vunpcklps_avx(auVar30,auVar37);
  auVar21 = vunpckhps_avx(auVar30,auVar37);
  auVar54 = vunpcklps_avx(auVar53,auVar23);
  auVar23 = vunpckhps_avx(auVar53,auVar23);
  auVar53 = vunpcklps_avx(auVar29,auVar21);
  auVar30 = vunpckhps_avx(auVar29,auVar21);
  auVar36 = vunpcklps_avx(auVar42,auVar44);
  auVar29 = vunpckhps_avx(auVar42,auVar44);
  auVar37 = vunpcklps_avx(auVar43,auVar45);
  auVar21 = vunpckhps_avx(auVar43,auVar45);
  auVar44 = vunpcklps_avx(auVar36,auVar37);
  auVar36 = vunpckhps_avx(auVar36,auVar37);
  auVar45 = vunpcklps_avx(auVar29,auVar21);
  auVar37 = vunpckhps_avx(auVar29,auVar21);
  auVar43 = vunpcklps_avx(auVar46,auVar47);
  auVar42 = vunpckhps_avx(auVar46,auVar47);
  auVar29 = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * lVar10);
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar10 * (ulong)(uVar7 + 1));
  auVar46 = vunpcklps_avx(auVar29,auVar21);
  auVar29 = vunpckhps_avx(auVar29,auVar21);
  auVar47 = vunpcklps_avx(auVar43,auVar46);
  auVar43 = vunpckhps_avx(auVar43,auVar46);
  auVar46 = vunpcklps_avx(auVar42,auVar29);
  auVar42 = vunpckhps_avx(auVar42,auVar29);
  auVar29 = vshufps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),0);
  auVar21 = vshufps_avx(ZEXT416((uint)(1.0 - fVar28)),ZEXT416((uint)(1.0 - fVar28)),0);
  fVar27 = auVar29._0_4_;
  fVar32 = auVar29._4_4_;
  fVar33 = auVar29._8_4_;
  fVar34 = auVar29._12_4_;
  local_290._0_4_ = auVar49._0_4_;
  local_290._4_4_ = auVar49._4_4_;
  fStack_288 = auVar49._8_4_;
  fStack_284 = auVar49._12_4_;
  fVar28 = auVar21._0_4_;
  fVar20 = auVar21._4_4_;
  fVar25 = auVar21._8_4_;
  fVar26 = auVar21._12_4_;
  auVar51._0_4_ = fVar27 * auVar44._0_4_ + fVar28 * (float)local_290._0_4_;
  auVar51._4_4_ = fVar32 * auVar44._4_4_ + fVar20 * (float)local_290._4_4_;
  auVar51._8_4_ = fVar33 * auVar44._8_4_ + fVar25 * fStack_288;
  auVar51._12_4_ = fVar34 * auVar44._12_4_ + fVar26 * fStack_284;
  local_220._0_4_ = fVar28 * auVar22._0_4_ + fVar27 * auVar36._0_4_;
  local_220._4_4_ = fVar20 * auVar22._4_4_ + fVar32 * auVar36._4_4_;
  local_220._8_4_ = fVar25 * auVar22._8_4_ + fVar33 * auVar36._8_4_;
  local_220._12_4_ = fVar26 * auVar22._12_4_ + fVar34 * auVar36._12_4_;
  local_310._0_4_ = auVar48._0_4_;
  local_310._4_4_ = auVar48._4_4_;
  fStack_308 = auVar48._8_4_;
  fStack_304 = auVar48._12_4_;
  local_230._0_4_ = fVar28 * (float)local_310._0_4_ + fVar27 * auVar45._0_4_;
  local_230._4_4_ = fVar20 * (float)local_310._4_4_ + fVar32 * auVar45._4_4_;
  local_230._8_4_ = fVar25 * fStack_308 + fVar33 * auVar45._8_4_;
  local_230._12_4_ = fVar26 * fStack_304 + fVar34 * auVar45._12_4_;
  local_290._0_4_ = auVar3._0_4_ * fVar28 + fVar27 * auVar37._0_4_;
  local_290._4_4_ = auVar3._4_4_ * fVar20 + fVar32 * auVar37._4_4_;
  fStack_288 = auVar3._8_4_ * fVar25 + fVar33 * auVar37._8_4_;
  fStack_284 = auVar3._12_4_ * fVar26 + fVar34 * auVar37._12_4_;
  local_210 = auVar54._0_4_ * fVar28 + fVar27 * auVar47._0_4_;
  fStack_20c = auVar54._4_4_ * fVar20 + fVar32 * auVar47._4_4_;
  fStack_208 = auVar54._8_4_ * fVar25 + fVar33 * auVar47._8_4_;
  fStack_204 = auVar54._12_4_ * fVar26 + fVar34 * auVar47._12_4_;
  local_310._4_4_ = fVar20 * auVar23._4_4_ + fVar32 * auVar43._4_4_;
  local_310._0_4_ = fVar28 * auVar23._0_4_ + fVar27 * auVar43._0_4_;
  fStack_308 = fVar25 * auVar23._8_4_ + fVar33 * auVar43._8_4_;
  fStack_304 = fVar26 * auVar23._12_4_ + fVar34 * auVar43._12_4_;
  local_320._0_4_ = auVar53._0_4_;
  local_320._4_4_ = auVar53._4_4_;
  fStack_318 = auVar53._8_4_;
  fStack_314 = auVar53._12_4_;
  local_320._4_4_ = fVar20 * (float)local_320._4_4_ + fVar32 * auVar46._4_4_;
  local_320._0_4_ = fVar28 * (float)local_320._0_4_ + fVar27 * auVar46._0_4_;
  fStack_318 = fVar25 * fStack_318 + fVar33 * auVar46._8_4_;
  fStack_314 = fVar26 * fStack_314 + fVar34 * auVar46._12_4_;
  local_280._0_4_ = auVar30._0_4_;
  local_280._4_4_ = auVar30._4_4_;
  fStack_278 = auVar30._8_4_;
  fStack_274 = auVar30._12_4_;
  local_200._0_4_ = fVar27 * auVar42._0_4_ + fVar28 * (float)local_280._0_4_;
  local_200._4_4_ = fVar32 * auVar42._4_4_ + fVar20 * (float)local_280._4_4_;
  local_200._8_4_ = fVar33 * auVar42._8_4_ + fVar25 * fStack_278;
  local_200._12_4_ = fVar34 * auVar42._12_4_ + fVar26 * fStack_274;
  auVar29 = vpcmpeqd_avx(local_200,local_200);
  _local_280 = vpcmpeqd_avx(auVar29,(undefined1  [16])(line->primIDs).field_0);
  local_1f0 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
  fVar28 = pre->ray_space[k].vy.field_0.m128[0];
  fVar20 = pre->ray_space[k].vz.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar29 = vsubps_avx(local_220,auVar67);
  auVar21 = vsubps_avx(local_230,auVar48);
  fVar39 = auVar21._0_4_;
  fVar41 = auVar21._4_4_;
  fVar64 = auVar21._8_4_;
  fVar66 = auVar21._12_4_;
  fVar40 = auVar29._0_4_;
  fVar63 = auVar29._4_4_;
  fVar65 = auVar29._8_4_;
  fVar15 = auVar29._12_4_;
  fVar25 = pre->ray_space[k].vy.field_0.m128[1];
  fVar26 = pre->ray_space[k].vz.field_0.m128[1];
  fVar27 = pre->ray_space[k].vz.field_0.m128[2];
  fVar32 = pre->ray_space[k].vy.field_0.m128[2];
  fVar33 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar29 = vsubps_avx(auVar51,auVar21);
  fVar56 = auVar29._0_4_;
  fVar59 = auVar29._4_4_;
  fVar60 = auVar29._8_4_;
  fVar61 = auVar29._12_4_;
  auVar53._0_4_ = fVar28 * fVar40 + fVar20 * fVar39 + fVar56 * fVar33;
  auVar53._4_4_ = fVar28 * fVar63 + fVar20 * fVar41 + fVar59 * fVar33;
  auVar53._8_4_ = fVar28 * fVar65 + fVar20 * fVar64 + fVar60 * fVar33;
  auVar53._12_4_ = fVar28 * fVar15 + fVar20 * fVar66 + fVar61 * fVar33;
  fVar34 = pre->ray_space[k].vx.field_0.m128[1];
  auVar62._0_4_ = fVar56 * fVar34 + fVar25 * fVar40 + fVar26 * fVar39;
  auVar62._4_4_ = fVar59 * fVar34 + fVar25 * fVar63 + fVar26 * fVar41;
  auVar62._8_4_ = fVar60 * fVar34 + fVar25 * fVar65 + fVar26 * fVar64;
  auVar62._12_4_ = fVar61 * fVar34 + fVar25 * fVar15 + fVar26 * fVar66;
  fVar35 = pre->ray_space[k].vx.field_0.m128[2];
  auVar57._0_4_ = fVar35 * fVar56 + fVar32 * fVar40 + fVar27 * fVar39;
  auVar57._4_4_ = fVar35 * fVar59 + fVar32 * fVar63 + fVar27 * fVar41;
  auVar57._8_4_ = fVar35 * fVar60 + fVar32 * fVar65 + fVar27 * fVar64;
  auVar57._12_4_ = fVar35 * fVar61 + fVar32 * fVar15 + fVar27 * fVar66;
  auVar29 = vsubps_avx(_local_320,auVar48);
  fVar39 = auVar29._0_4_;
  fVar63 = auVar29._4_4_;
  fVar66 = auVar29._8_4_;
  fVar59 = auVar29._12_4_;
  auVar29 = vsubps_avx(_local_310,auVar67);
  auVar3._4_4_ = fStack_20c;
  auVar3._0_4_ = local_210;
  auVar3._8_4_ = fStack_208;
  auVar3._12_4_ = fStack_204;
  fVar40 = auVar29._0_4_;
  fVar64 = auVar29._4_4_;
  fVar15 = auVar29._8_4_;
  fVar60 = auVar29._12_4_;
  auVar29 = vsubps_avx(auVar3,auVar21);
  fVar41 = auVar29._0_4_;
  fVar65 = auVar29._4_4_;
  fVar56 = auVar29._8_4_;
  fVar61 = auVar29._12_4_;
  auVar42._0_4_ = fVar33 * fVar41 + fVar28 * fVar40 + fVar20 * fVar39;
  auVar42._4_4_ = fVar33 * fVar65 + fVar28 * fVar64 + fVar20 * fVar63;
  auVar42._8_4_ = fVar33 * fVar56 + fVar28 * fVar15 + fVar20 * fVar66;
  auVar42._12_4_ = fVar33 * fVar61 + fVar28 * fVar60 + fVar20 * fVar59;
  auVar36._0_4_ = fVar34 * fVar41 + fVar25 * fVar40 + fVar26 * fVar39;
  auVar36._4_4_ = fVar34 * fVar65 + fVar25 * fVar64 + fVar26 * fVar63;
  auVar36._8_4_ = fVar34 * fVar56 + fVar25 * fVar15 + fVar26 * fVar66;
  auVar36._12_4_ = fVar34 * fVar61 + fVar25 * fVar60 + fVar26 * fVar59;
  auVar22._0_4_ = fVar35 * fVar41 + fVar32 * fVar40 + fVar27 * fVar39;
  auVar22._4_4_ = fVar35 * fVar65 + fVar32 * fVar64 + fVar27 * fVar63;
  auVar22._8_4_ = fVar35 * fVar56 + fVar32 * fVar15 + fVar27 * fVar66;
  auVar22._12_4_ = fVar35 * fVar61 + fVar32 * fVar60 + fVar27 * fVar59;
  auVar29 = vsubps_avx(auVar42,auVar53);
  auVar21 = vsubps_avx(auVar36,auVar62);
  fVar27 = auVar21._0_4_;
  auVar43._0_4_ = fVar27 * -auVar62._0_4_;
  fVar39 = auVar21._4_4_;
  auVar43._4_4_ = fVar39 * -auVar62._4_4_;
  fVar40 = auVar21._8_4_;
  auVar43._8_4_ = fVar40 * -auVar62._8_4_;
  fVar41 = auVar21._12_4_;
  auVar43._12_4_ = fVar41 * -auVar62._12_4_;
  fVar28 = auVar29._0_4_;
  auVar45._0_4_ = auVar53._0_4_ * fVar28;
  fVar20 = auVar29._4_4_;
  auVar45._4_4_ = auVar53._4_4_ * fVar20;
  fVar25 = auVar29._8_4_;
  auVar45._8_4_ = auVar53._8_4_ * fVar25;
  fVar26 = auVar29._12_4_;
  auVar45._12_4_ = auVar53._12_4_ * fVar26;
  auVar21 = vsubps_avx(auVar43,auVar45);
  auVar46._0_4_ = fVar28 * fVar28 + fVar27 * fVar27;
  auVar46._4_4_ = fVar20 * fVar20 + fVar39 * fVar39;
  auVar46._8_4_ = fVar25 * fVar25 + fVar40 * fVar40;
  auVar46._12_4_ = fVar26 * fVar26 + fVar41 * fVar41;
  auVar29 = vrcpps_avx(auVar46);
  fVar32 = auVar29._0_4_;
  auVar47._0_4_ = fVar32 * auVar46._0_4_;
  fVar33 = auVar29._4_4_;
  auVar47._4_4_ = fVar33 * auVar46._4_4_;
  fVar34 = auVar29._8_4_;
  auVar47._8_4_ = fVar34 * auVar46._8_4_;
  fVar35 = auVar29._12_4_;
  auVar47._12_4_ = fVar35 * auVar46._12_4_;
  auVar49._8_4_ = 0x3f800000;
  auVar49._0_8_ = 0x3f8000003f800000;
  auVar49._12_4_ = 0x3f800000;
  auVar29 = vsubps_avx(auVar49,auVar47);
  auVar44._0_4_ = auVar21._0_4_ * (fVar32 + fVar32 * auVar29._0_4_);
  auVar44._4_4_ = auVar21._4_4_ * (fVar33 + fVar33 * auVar29._4_4_);
  auVar44._8_4_ = auVar21._8_4_ * (fVar34 + fVar34 * auVar29._8_4_);
  auVar44._12_4_ = auVar21._12_4_ * (fVar35 + fVar35 * auVar29._12_4_);
  auVar29 = vminps_avx(auVar44,auVar49);
  auVar36 = ZEXT416(0) << 0x20;
  local_1e0 = vmaxps_avx(auVar29,auVar36);
  fVar63 = local_1e0._0_4_;
  fVar64 = local_1e0._4_4_;
  fVar65 = local_1e0._8_4_;
  fVar66 = local_1e0._12_4_;
  fVar28 = auVar53._0_4_ + fVar63 * fVar28;
  fVar32 = auVar53._4_4_ + fVar64 * fVar20;
  fVar33 = auVar53._8_4_ + fVar65 * fVar25;
  fVar34 = auVar53._12_4_ + fVar66 * fVar26;
  fVar35 = auVar62._0_4_ + fVar63 * fVar27;
  fVar39 = auVar62._4_4_ + fVar64 * fVar39;
  fVar40 = auVar62._8_4_ + fVar65 * fVar40;
  fVar41 = auVar62._12_4_ + fVar66 * fVar41;
  auVar29 = vsubps_avx(auVar22,auVar57);
  auVar21 = vsubps_avx(local_200,_local_290);
  local_1c0._0_4_ = auVar57._0_4_ + fVar63 * auVar29._0_4_;
  local_1c0._4_4_ = auVar57._4_4_ + fVar64 * auVar29._4_4_;
  local_1c0._8_4_ = auVar57._8_4_ + fVar65 * auVar29._8_4_;
  local_1c0._12_4_ = auVar57._12_4_ + fVar66 * auVar29._12_4_;
  fVar20 = (float)local_290._0_4_ + fVar63 * auVar21._0_4_;
  fVar25 = (float)local_290._4_4_ + fVar64 * auVar21._4_4_;
  fVar26 = fStack_288 + fVar65 * auVar21._8_4_;
  fVar27 = fStack_284 + fVar66 * auVar21._12_4_;
  auVar29._0_4_ = fVar28 * fVar28 + fVar35 * fVar35;
  auVar29._4_4_ = fVar32 * fVar32 + fVar39 * fVar39;
  auVar29._8_4_ = fVar33 * fVar33 + fVar40 * fVar40;
  auVar29._12_4_ = fVar34 * fVar34 + fVar41 * fVar41;
  auVar37._0_4_ = fVar20 * fVar20;
  auVar37._4_4_ = fVar25 * fVar25;
  auVar37._8_4_ = fVar26 * fVar26;
  auVar37._12_4_ = fVar27 * fVar27;
  auVar21 = vcmpps_avx(auVar29,auVar37,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar29 = vcmpps_avx(auVar30,local_1c0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar55 = ZEXT1664(auVar54);
  auVar22 = vcmpps_avx(local_1c0,auVar54,2);
  auVar29 = vandps_avx(auVar29,auVar22);
  auVar29 = vandnps_avx(_local_280,auVar29);
  fVar28 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
  auVar23._0_4_ = fVar28 * (fVar20 + fVar20);
  auVar23._4_4_ = fVar28 * (fVar25 + fVar25);
  auVar23._8_4_ = fVar28 * (fVar26 + fVar26);
  auVar23._12_4_ = fVar28 * (fVar27 + fVar27);
  auVar22 = vcmpps_avx(local_1c0,auVar23,6);
  auVar29 = vandps_avx(auVar29,auVar22);
  auVar22 = auVar21 & auVar29;
  if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar22[0xf] < '\0') {
    auVar29 = vandps_avx(auVar29,auVar21);
    local_1b0 = vsubps_avx(auVar3,auVar51);
    local_1a0 = vsubps_avx(_local_310,local_220);
    local_190 = vsubps_avx(_local_320,local_230);
    auVar21 = vcmpps_avx(auVar36,local_1b0,4);
    auVar22 = vcmpps_avx(auVar36,local_1a0,4);
    auVar22 = vorps_avx(auVar21,auVar22);
    auVar21 = vcmpps_avx(auVar36,local_190,4);
    auVar21 = vorps_avx(auVar22,auVar21);
    auVar29 = vandps_avx(auVar29,auVar21);
    iVar16 = vmovmskps_avx(auVar29);
    if (iVar16 != 0) {
      auVar50 = ZEXT864(0) << 0x20;
      local_1d0 = ZEXT816(0) << 0x20;
      uVar18 = (ulong)(byte)iVar16;
      uVar17 = 1 << ((byte)k & 0x1f);
      auVar38 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar52 = ZEXT3264(auVar38);
      auVar58 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_270 = line;
      local_268 = context;
      do {
        local_260.hit = local_180;
        local_260.valid = (int *)local_2e0;
        uVar14 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        uVar4 = *(uint *)(local_1f0 + uVar14 * 4);
        pGVar9 = (pSVar8->geometries).items[uVar4].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_1e0 + uVar14 * 4);
          local_100 = *(undefined4 *)(local_1d0 + uVar14 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar14 * 4);
          local_260.context = context->user;
          local_e0 = (local_270->primIDs).field_0.i[uVar14];
          uVar1 = *(undefined4 *)(local_1b0 + uVar14 * 4);
          uVar2 = *(undefined4 *)(local_1a0 + uVar14 * 4);
          local_160._4_4_ = uVar2;
          local_160._0_4_ = uVar2;
          local_160._8_4_ = uVar2;
          local_160._12_4_ = uVar2;
          local_160._16_4_ = uVar2;
          local_160._20_4_ = uVar2;
          local_160._24_4_ = uVar2;
          local_160._28_4_ = uVar2;
          local_b0 = vpshufd_avx(ZEXT416(uVar4),0);
          uVar2 = *(undefined4 *)(local_190 + uVar14 * 4);
          local_140._4_4_ = uVar2;
          local_140._0_4_ = uVar2;
          local_140._8_4_ = uVar2;
          local_140._12_4_ = uVar2;
          local_140._16_4_ = uVar2;
          local_140._20_4_ = uVar2;
          local_140._24_4_ = uVar2;
          local_140._28_4_ = uVar2;
          local_180[0] = (RTCHitN)(char)uVar1;
          local_180[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar1;
          local_180[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar1;
          local_180[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar1;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar1;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar1;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar1;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar1;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          local_2c0 = auVar52._0_32_;
          uStack_9c = (local_260.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_260.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar17 & 0xf) << 4));
          local_2d0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar17 >> 4) * 0x10);
          local_260.geometryUserPtr = pGVar9->userPtr;
          local_260.N = 8;
          local_260.ray = (RTCRayN *)ray;
          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar9->occlusionFilterN)(&local_260);
            auVar58 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar52 = ZEXT3264(local_2c0);
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar55 = ZEXT1664(auVar55._0_16_);
          }
          auVar29 = vpcmpeqd_avx(local_2e0,auVar50._0_16_);
          auVar21 = vpcmpeqd_avx(local_2d0,auVar50._0_16_);
          auVar38._16_16_ = auVar21;
          auVar38._0_16_ = auVar29;
          local_2c0 = auVar52._0_32_;
          auVar38 = local_2c0 & ~auVar38;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar38 >> 0x7f,0) == '\0') &&
                (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar38 >> 0xbf,0) == '\0') &&
              (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar38[0x1f]) {
            auVar24._0_4_ = auVar52._0_4_ ^ auVar29._0_4_;
            auVar24._4_4_ = auVar52._4_4_ ^ auVar29._4_4_;
            auVar24._8_4_ = auVar52._8_4_ ^ auVar29._8_4_;
            auVar24._12_4_ = auVar52._12_4_ ^ auVar29._12_4_;
            auVar24._16_4_ = auVar52._16_4_ ^ auVar21._0_4_;
            auVar24._20_4_ = auVar52._20_4_ ^ auVar21._4_4_;
            auVar24._24_4_ = auVar52._24_4_ ^ auVar21._8_4_;
            auVar24._28_4_ = auVar52._28_4_ ^ auVar21._12_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_260);
              auVar58 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar52 = ZEXT3264(local_2c0);
              auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar55 = ZEXT1664(auVar55._0_16_);
            }
            auVar29 = vpcmpeqd_avx(local_2e0,auVar50._0_16_);
            auVar21 = vpcmpeqd_avx(local_2d0,auVar50._0_16_);
            auVar31._16_16_ = auVar21;
            auVar31._0_16_ = auVar29;
            auVar24._0_4_ = auVar52._0_4_ ^ auVar29._0_4_;
            auVar24._4_4_ = auVar52._4_4_ ^ auVar29._4_4_;
            auVar24._8_4_ = auVar52._8_4_ ^ auVar29._8_4_;
            auVar24._12_4_ = auVar52._12_4_ ^ auVar29._12_4_;
            auVar24._16_4_ = auVar52._16_4_ ^ auVar21._0_4_;
            auVar24._20_4_ = auVar52._20_4_ ^ auVar21._4_4_;
            auVar24._24_4_ = auVar52._24_4_ ^ auVar21._8_4_;
            auVar24._28_4_ = auVar52._28_4_ ^ auVar21._12_4_;
            auVar38 = vblendvps_avx(auVar58._0_32_,*(undefined1 (*) [32])(local_260.ray + 0x100),
                                    auVar31);
            *(undefined1 (*) [32])(local_260.ray + 0x100) = auVar38;
          }
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            return true;
          }
          *(int *)(ray + k * 4 + 0x100) = auVar55._0_4_;
        }
        uVar18 = uVar18 ^ 1L << (uVar14 & 0x3f);
      } while (uVar18 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }